

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void * lua_topointer(lua_State *L,int idx)

{
  byte bVar1;
  ushort uVar2;
  TValue *pTVar3;
  long lVar4;
  byte bVar5;
  
  pTVar3 = index2value(L,idx);
  bVar1 = pTVar3->tt_;
  bVar5 = bVar1 & 0x3f;
  if ((bVar5 == 2) || (bVar5 == 7)) {
    if ((bVar1 & 0xf) == 2) goto LAB_00106d47;
    if ((bVar1 & 0xf) == 7) {
      uVar2 = *(ushort *)((pTVar3->value_).f + 10);
      lVar4 = 0x20;
      if (uVar2 != 0) {
        lVar4 = (ulong)uVar2 * 0x10 + 0x28;
      }
      return (pTVar3->value_).f + lVar4;
    }
  }
  else if ((bVar5 == 0x16) || ((bVar1 & 0x40) != 0)) {
LAB_00106d47:
    return (pTVar3->value_).gc;
  }
  return (void *)0x0;
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  const TValue *o = index2value(L, idx);
  switch (ttypetag(o)) {
    case LUA_VLCF: return cast_voidp(cast_sizet(fvalue(o)));
    case LUA_VUSERDATA: case LUA_VLIGHTUSERDATA:
      return touserdata(o);
    default: {
      if (iscollectable(o))
        return gcvalue(o);
      else
        return NULL;
    }
  }
}